

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManInvertMarks(If_DsdMan_t *p,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  int local_24;
  int i;
  If_DsdObj_t *pObj;
  int fVerbose_local;
  If_DsdMan_t *p_local;
  
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(&p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar2 = Vec_PtrEntry(&p->vObjs,local_24);
    *(uint *)((long)pvVar2 + 4) =
         *(uint *)((long)pvVar2 + 4) & 0xfffffeff |
         (uint)((*(uint *)((long)pvVar2 + 4) >> 8 & 1) == 0) << 8;
  }
  return;
}

Assistant:

void If_DsdManInvertMarks( If_DsdMan_t * p, int fVerbose )
{
    If_DsdObj_t * pObj; 
    int i;
    ABC_FREE( p->pCellStr );
    //Vec_WrdFreeP( &p->vConfigs );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        pObj->fMark = !pObj->fMark;
}